

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

int xmlEscapeEntities(uchar *out,int *outlen,xmlChar *in,int *inlen)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  xmlGenericErrorFunc p_Var4;
  int iVar5;
  long lVar6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  char *msg;
  byte *pbVar9;
  byte *pbVar10;
  uint val;
  uint uVar11;
  byte *out_00;
  int iVar12;
  long lVar13;
  
  iVar3 = (int)in;
  out_00 = out;
  if (*outlen < 1 || (long)*inlen < 1) {
LAB_001af90b:
    iVar12 = (int)in;
    iVar5 = 0;
LAB_001af90d:
    *outlen = (int)out_00 - (int)out;
    *inlen = iVar12 - iVar3;
    return iVar5;
  }
  pbVar9 = out + *outlen;
  pbVar10 = in + *inlen;
  do {
    bVar2 = *in;
    if (bVar2 == 0x26) {
      if ((long)pbVar9 - (long)out_00 < 5) goto LAB_001af90b;
      out_00[0] = 0x26;
      out_00[1] = 0x61;
      out_00[2] = 0x6d;
      out_00[3] = 0x70;
      out_00[4] = 0x3b;
      out_00 = out_00 + 5;
LAB_001af766:
      in = in + 1;
    }
    else {
      if (bVar2 == 0x3e) {
        if (3 < (long)pbVar9 - (long)out_00) {
          out_00[0] = 0x26;
          out_00[1] = 0x67;
          out_00[2] = 0x74;
          out_00[3] = 0x3b;
LAB_001af723:
          out_00 = out_00 + 4;
          goto LAB_001af766;
        }
        goto LAB_001af90b;
      }
      uVar11 = (uint)bVar2;
      if (uVar11 == 0x3c) {
        if (3 < (long)pbVar9 - (long)out_00) {
          out_00[0] = 0x26;
          out_00[1] = 0x6c;
          out_00[2] = 0x74;
          out_00[3] = 0x3b;
          goto LAB_001af723;
        }
        goto LAB_001af90b;
      }
      if (('\x1f' < (char)bVar2) || ((byte)(bVar2 - 9) < 2)) {
        *out_00 = bVar2;
        out_00 = out_00 + 1;
        goto LAB_001af766;
      }
      val = (uint)bVar2;
      if ((char)bVar2 < '\0') {
        if ((long)pbVar9 - (long)out_00 < 0xb) goto LAB_001af90b;
        if (bVar2 < 0xc0) {
          msg = "string is not in UTF-8\n";
          iVar5 = 0x578;
LAB_001af94c:
          __xmlSimpleError(7,iVar5,(xmlNodePtr)0x0,msg,(char *)0x0);
          goto LAB_001af993;
        }
        if (bVar2 < 0xe0) {
          if ((long)pbVar10 - (long)in < 2) goto LAB_001af90b;
          uVar11 = (val & 0x1f) << 6;
          lVar13 = 2;
          lVar6 = 1;
        }
        else if (bVar2 < 0xf0) {
          if ((long)pbVar10 - (long)in < 3) goto LAB_001af90b;
          uVar11 = (in[1] & 0x3f | (val & 0xf) << 6) << 6;
          lVar13 = 3;
          lVar6 = 2;
        }
        else {
          if (0xf7 < bVar2) {
            msg = "invalid character value\n";
            iVar5 = 0x579;
            goto LAB_001af94c;
          }
          if ((long)pbVar10 - (long)in < 4) goto LAB_001af90b;
          uVar11 = (in[2] & 0x3f) << 6 | (in[1] & 0x3f | (uVar11 & 7) << 6) << 0xc;
          lVar13 = 4;
          lVar6 = 3;
        }
        pbVar1 = in + lVar6;
        uVar11 = *pbVar1 & 0x3f | uVar11;
        in = in + lVar13;
        if (uVar11 < 0x100) {
          if ((uVar11 < 0x20) && ((0xd < uVar11 || ((0x2600U >> (*pbVar1 & 0x1f) & 1) == 0)))) {
LAB_001af978:
            __xmlSimpleError(7,0x579,(xmlNodePtr)0x0,"invalid character value\n",(char *)0x0);
            goto LAB_001af993;
          }
        }
        else if (0xfffff < uVar11 - 0x10000 && (0x1ffd < uVar11 - 0xe000 && 0xd7ff < uVar11))
        goto LAB_001af978;
        out_00 = xmlSerializeHexCharRef(out_00,uVar11);
      }
      else {
        if ((0xd < uVar11) || ((0x2600U >> (uVar11 & 0x1f) & 1) == 0)) {
          pp_Var7 = __xmlGenericError();
          p_Var4 = *pp_Var7;
          ppvVar8 = __xmlGenericErrorContext();
          (*p_Var4)(*ppvVar8,"xmlEscapeEntities : char out of range\n");
LAB_001af993:
          iVar12 = (int)in + 1;
          iVar5 = -1;
          goto LAB_001af90d;
        }
        if ((long)pbVar9 - (long)out_00 < 6) goto LAB_001af90b;
        in = in + 1;
        out_00 = xmlSerializeHexCharRef(out_00,val);
      }
    }
    if ((pbVar10 <= in) || (pbVar9 <= out_00)) goto LAB_001af90b;
  } while( true );
}

Assistant:

static int
xmlEscapeEntities(unsigned char* out, int *outlen,
                 const xmlChar* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    int val;

    inend = in + (*inlen);

    while ((in < inend) && (out < outend)) {
	if (*in == '<') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'l';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '>') {
	    if (outend - out < 4) break;
	    *out++ = '&';
	    *out++ = 'g';
	    *out++ = 't';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (*in == '&') {
	    if (outend - out < 5) break;
	    *out++ = '&';
	    *out++ = 'a';
	    *out++ = 'm';
	    *out++ = 'p';
	    *out++ = ';';
	    in++;
	    continue;
	} else if (((*in >= 0x20) && (*in < 0x80)) ||
	           (*in == '\n') || (*in == '\t')) {
	    /*
	     * default case, just copy !
	     */
	    *out++ = *in++;
	    continue;
	} else if (*in >= 0x80) {
	    /*
	     * We assume we have UTF-8 input.
	     */
	    if (outend - out < 11) break;

	    if (*in < 0xC0) {
		xmlSaveErr(XML_SAVE_NOT_UTF8, NULL, NULL);
		in++;
		goto error;
	    } else if (*in < 0xE0) {
		if (inend - in < 2) break;
		val = (in[0]) & 0x1F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		in += 2;
	    } else if (*in < 0xF0) {
		if (inend - in < 3) break;
		val = (in[0]) & 0x0F;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		in += 3;
	    } else if (*in < 0xF8) {
		if (inend - in < 4) break;
		val = (in[0]) & 0x07;
		val <<= 6;
		val |= (in[1]) & 0x3F;
		val <<= 6;
		val |= (in[2]) & 0x3F;
		val <<= 6;
		val |= (in[3]) & 0x3F;
		in += 4;
	    } else {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }
	    if (!IS_CHAR(val)) {
		xmlSaveErr(XML_SAVE_CHAR_INVALID, NULL, NULL);
		in++;
		goto error;
	    }

	    /*
	     * We could do multiple things here. Just save as a char ref
	     */
	    out = xmlSerializeHexCharRef(out, val);
	} else if (IS_BYTE_CHAR(*in)) {
	    if (outend - out < 6) break;
	    out = xmlSerializeHexCharRef(out, *in++);
	} else {
	    xmlGenericError(xmlGenericErrorContext,
		"xmlEscapeEntities : char out of range\n");
	    in++;
	    goto error;
	}
    }
    *outlen = out - outstart;
    *inlen = in - base;
    return(0);
error:
    *outlen = out - outstart;
    *inlen = in - base;
    return(-1);
}